

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *__s_00;
  char *pcVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  char cVar7;
  string *in_RDI;
  FilePath output_name;
  FilePath result;
  string format;
  string s;
  FilePath local_1b8;
  allocator<char> local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  FilePath local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  long local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  long local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,FLAGS_gtest_output_abi_cxx11_,
             DAT_002a5ab0 + FLAGS_gtest_output_abi_cxx11_);
  __s_00 = local_70[0];
  GetOutputFormat_abi_cxx11_();
  if (local_88 == 0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xml","");
    GetAbsolutePathToOutputFile_abi_cxx11_();
  }
  pcVar3 = strchr((char *)__s_00,0x3a);
  if (pcVar3 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_150);
    lVar2 = local_c8;
    if (local_d0 == &local_c0) {
      local_170.field_2._8_4_ = local_c0._8_4_;
      local_170.field_2._12_4_ = local_c0._12_4_;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170._M_dataplus._M_p = (pointer)local_d0;
    }
    local_170.field_2._M_allocated_capacity._4_4_ = local_c0._M_allocated_capacity._4_4_;
    local_170.field_2._M_allocated_capacity._0_4_ = local_c0._M_allocated_capacity._0_4_;
    local_c8 = 0;
    local_c0._M_allocated_capacity._0_4_ = local_c0._M_allocated_capacity._0_4_ & 0xffffff00;
    _Var5._M_p = local_170._M_dataplus._M_p;
    _Var6._M_p = local_170._M_dataplus._M_p;
    if (lVar2 != 0) {
      do {
        cVar7 = *_Var6._M_p;
        if (((cVar7 != '/') || (cVar7 = '/', _Var5._M_p == local_170._M_dataplus._M_p)) ||
           (_Var5._M_p[-1] != '/')) {
          *_Var5._M_p = cVar7;
          _Var5._M_p = _Var5._M_p + 1;
        }
        _Var6._M_p = _Var6._M_p + 1;
      } while (_Var6._M_p != local_170._M_dataplus._M_p + lVar2);
    }
    local_170._M_string_length = (long)_Var5._M_p - (long)local_170._M_dataplus._M_p;
    *_Var5._M_p = '\0';
    local_f0 = &local_e0;
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_detail","");
    lVar2 = local_e8;
    paVar1 = &local_1b8.pathname_.field_2;
    if (local_f0 == &local_e0) {
      local_1b8.pathname_.field_2._8_8_ = local_e0._8_8_;
      local_1b8.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.pathname_._M_dataplus._M_p = (pointer)local_f0;
    }
    local_1b8.pathname_.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_1b8.pathname_.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    _Var5._M_p = local_1b8.pathname_._M_dataplus._M_p;
    _Var6._M_p = local_1b8.pathname_._M_dataplus._M_p;
    if (lVar2 != 0) {
      do {
        cVar7 = *_Var6._M_p;
        if (((cVar7 != '/') || (cVar7 = '/', _Var5._M_p == local_1b8.pathname_._M_dataplus._M_p)) ||
           (_Var5._M_p[-1] != '/')) {
          *_Var5._M_p = cVar7;
          _Var5._M_p = _Var5._M_p + 1;
        }
        _Var6._M_p = _Var6._M_p + 1;
      } while (_Var6._M_p != local_1b8.pathname_._M_dataplus._M_p + lVar2);
    }
    local_1b8.pathname_._M_string_length =
         (long)_Var5._M_p - (long)local_1b8.pathname_._M_dataplus._M_p;
    *_Var5._M_p = '\0';
    local_f0 = &local_e0;
    FilePath::MakeFileName
              ((FilePath *)&local_190,(FilePath *)&local_170,&local_1b8,0,(char *)local_90);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8.pathname_._M_dataplus._M_p,
                      local_1b8.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 == &local_c0) goto LAB_002026e7;
    local_190.field_2._M_allocated_capacity =
         CONCAT44(local_c0._M_allocated_capacity._4_4_,local_c0._M_allocated_capacity._0_4_);
    _Var5._M_p = (pointer)local_d0;
  }
  else {
    __s = pcVar3 + 1;
    local_b0 = &local_a0;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,pcVar3 + sVar4 + 1);
    if (local_b0 == &local_a0) {
      local_190.field_2._8_8_ = local_a0._8_8_;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190._M_dataplus._M_p = (pointer)local_b0;
    }
    local_190.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
    local_190.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
    _Var5._M_p = local_190._M_dataplus._M_p;
    _Var6._M_p = local_190._M_dataplus._M_p;
    if (local_a8 != 0) {
      do {
        cVar7 = *_Var6._M_p;
        if (((cVar7 != '/') || (cVar7 = '/', _Var5._M_p == local_190._M_dataplus._M_p)) ||
           (_Var5._M_p[-1] != '/')) {
          *_Var5._M_p = cVar7;
          _Var5._M_p = _Var5._M_p + 1;
        }
        _Var6._M_p = _Var6._M_p + 1;
      } while (_Var6._M_p != local_190._M_dataplus._M_p + local_a8);
    }
    local_190._M_string_length = (long)_Var5._M_p - (long)local_190._M_dataplus._M_p;
    *_Var5._M_p = '\0';
    local_a0._M_local_buf[0] = '\0';
    local_a8 = 0;
    _Var5._M_p = local_190._M_dataplus._M_p;
    if (local_190._M_string_length != 0) {
      _Var5._M_p = local_190._M_dataplus._M_p + (*local_190._M_dataplus._M_p == '/');
    }
    local_b0 = &local_a0;
    if (_Var5._M_p == local_190._M_dataplus._M_p) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_191);
      lVar2 = local_128;
      local_1b8.pathname_._M_dataplus._M_p = (pointer)&local_1b8.pathname_.field_2;
      if (local_130 == &local_120) {
        local_1b8.pathname_.field_2._8_8_ = local_120._8_8_;
      }
      else {
        local_1b8.pathname_._M_dataplus._M_p = (pointer)local_130;
      }
      local_1b8.pathname_.field_2._M_allocated_capacity._1_7_ =
           local_120._M_allocated_capacity._1_7_;
      local_1b8.pathname_.field_2._M_local_buf[0] = local_120._M_local_buf[0];
      local_128 = 0;
      local_120._M_local_buf[0] = '\0';
      _Var5._M_p = local_1b8.pathname_._M_dataplus._M_p;
      _Var6._M_p = local_1b8.pathname_._M_dataplus._M_p;
      if (lVar2 != 0) {
        do {
          cVar7 = *_Var6._M_p;
          if (((cVar7 != '/') || (cVar7 = '/', _Var5._M_p == local_1b8.pathname_._M_dataplus._M_p))
             || (_Var5._M_p[-1] != '/')) {
            *_Var5._M_p = cVar7;
            _Var5._M_p = _Var5._M_p + 1;
          }
          _Var6._M_p = _Var6._M_p + 1;
        } while (_Var6._M_p != local_1b8.pathname_._M_dataplus._M_p + lVar2);
      }
      local_1b8.pathname_._M_string_length =
           (long)_Var5._M_p - (long)local_1b8.pathname_._M_dataplus._M_p;
      *_Var5._M_p = '\0';
      local_130 = &local_120;
      local_110 = &local_100;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,__s,__s + sVar4);
      lVar2 = local_108;
      paVar1 = &local_150.pathname_.field_2;
      if (local_110 == &local_100) {
        local_150.pathname_.field_2._8_8_ = local_100._8_8_;
        local_150.pathname_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_150.pathname_._M_dataplus._M_p = (pointer)local_110;
      }
      local_150.pathname_.field_2._M_allocated_capacity._1_7_ =
           local_100._M_allocated_capacity._1_7_;
      local_150.pathname_.field_2._M_local_buf[0] = local_100._M_local_buf[0];
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      _Var5._M_p = local_150.pathname_._M_dataplus._M_p;
      _Var6._M_p = local_150.pathname_._M_dataplus._M_p;
      if (lVar2 != 0) {
        do {
          cVar7 = *_Var6._M_p;
          if (((cVar7 != '/') || (cVar7 = '/', _Var5._M_p == local_150.pathname_._M_dataplus._M_p))
             || (_Var5._M_p[-1] != '/')) {
            *_Var5._M_p = cVar7;
            _Var5._M_p = _Var5._M_p + 1;
          }
          _Var6._M_p = _Var6._M_p + 1;
        } while (_Var6._M_p != local_150.pathname_._M_dataplus._M_p + lVar2);
      }
      local_150.pathname_._M_string_length =
           (long)_Var5._M_p - (long)local_150.pathname_._M_dataplus._M_p;
      *_Var5._M_p = '\0';
      local_110 = &local_100;
      FilePath::ConcatPaths((FilePath *)&local_170,&local_1b8,&local_150);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_190,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.pathname_._M_dataplus._M_p != paVar1) {
        operator_delete(local_150.pathname_._M_dataplus._M_p,
                        local_150.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,
                        CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.pathname_._M_dataplus._M_p != &local_1b8.pathname_.field_2) {
        operator_delete(local_1b8.pathname_._M_dataplus._M_p,
                        local_1b8.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,
                        CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) +
                        1);
      }
    }
    if ((local_190._M_string_length == 0) ||
       (local_190._M_dataplus._M_p[local_190._M_string_length - 1] != '/')) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                ((FilePath *)&local_170,(FilePath *)&local_190,&local_1b8,
                 local_150.pathname_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.pathname_._M_dataplus._M_p != &local_150.pathname_.field_2) {
        operator_delete(local_150.pathname_._M_dataplus._M_p,
                        local_150.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.pathname_._M_dataplus._M_p != &local_1b8.pathname_.field_2) {
        operator_delete(local_1b8.pathname_._M_dataplus._M_p,
                        local_1b8.pathname_.field_2._M_allocated_capacity + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
    _Var5._M_p = local_190._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_002026e7;
  }
  operator_delete(_Var5._M_p,local_190.field_2._M_allocated_capacity + 1);
LAB_002026e7:
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}